

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int64_t JS_FlattenIntoArray(JSContext *ctx,JSValue target,JSValue source,int64_t sourceLen,
                           int64_t targetIndex,int depth,JSValue mapperFunction,JSValue thisArg)

{
  JSValue mapperFunction_00;
  JSValue val;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue obj;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v_04;
  JSValue source_00;
  JSValue target_00;
  BOOL BVar1;
  int iVar2;
  int64_t in_RCX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  JSValueUnion in_R8;
  JSContext *in_R9;
  JSValue JVar3;
  int64_t unaff_retaddr;
  int iStack0000000000000008;
  int in_stack_00000010;
  undefined1 in_stack_00000014 [12];
  JSValue in_stack_00000020;
  JSValue args [3];
  int is_array;
  int present;
  int64_t elementLen;
  int64_t sourceIndex;
  JSValue element;
  JSValue v;
  JSValueUnion *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  JSValueUnion in_stack_fffffffffffffe58;
  int64_t in_stack_fffffffffffffe60;
  int64_t *in_stack_fffffffffffffe68;
  JSContext *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  JSValueUnion *in_stack_fffffffffffffe80;
  JSValueUnion JVar4;
  JSValue *pJVar5;
  JSValue in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  JSContext *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  JSValue *in_stack_fffffffffffffec0;
  JSValueUnion local_118;
  int64_t local_110;
  JSValueUnion local_108;
  int64_t in_stack_ffffffffffffff00;
  JSValueUnion local_f8 [3];
  long local_b8;
  JSValueUnion local_b0;
  int64_t in_stack_ffffffffffffff58;
  JSValueUnion *local_70;
  JSValueUnion local_68;
  double local_60;
  JSValueUnion local_38;
  double local_30;
  undefined4 uStack_14;
  
  JVar4.ptr = &stack0x00000028;
  pJVar5 = (JSValue *)(&stack0x00000014 + 4);
  BVar1 = js_check_stack_overflow
                    ((JSRuntime *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (size_t)in_stack_fffffffffffffe48);
  if (BVar1 == 0) {
    local_110 = in_stack_ffffffffffffff58;
    for (local_b8 = 0; local_b8 < (long)in_R9; local_b8 = local_b8 + 1) {
      JVar3.u._4_4_ = in_stack_fffffffffffffebc;
      JVar3.u.int32 = in_stack_fffffffffffffeb8;
      JVar3.tag = (int64_t)in_stack_fffffffffffffec0;
      iVar2 = JS_TryGetPropertyInt64
                        (in_stack_fffffffffffffeb0,JVar3,
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (JSValue *)in_stack_fffffffffffffe98.tag);
      if (iVar2 < 0) {
        return -1;
      }
      if (iVar2 != 0) {
        iVar2 = JS_IsUndefined(*pJVar5);
        if (iVar2 == 0) {
          local_108 = local_b0;
          in_stack_fffffffffffffe80 = local_f8;
          if (local_b8 == (int)local_b8) {
            local_38._4_4_ = uStack_14;
            local_38.int32 = (int)local_b8;
            local_30 = 0.0;
            in_stack_ffffffffffffff00 = local_110;
          }
          else {
            JVar3 = __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)local_b8);
            local_68 = JVar3.u;
            local_38 = local_68;
            local_60 = (double)JVar3.tag;
            local_30 = local_60;
            in_stack_ffffffffffffff00 = local_110;
          }
          *in_stack_fffffffffffffe80 = local_38;
          in_stack_fffffffffffffe80[1].float64 = local_30;
          in_stack_fffffffffffffe48 = &local_108;
          this_obj.tag = (int64_t)pJVar5;
          this_obj.u.ptr = JVar4.ptr;
          JVar3 = JS_Call((JSContext *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe98,this_obj,
                          in_stack_fffffffffffffe7c,in_stack_fffffffffffffec0);
          local_118 = JVar3.u;
          local_b0.float64 = local_118.float64;
          local_110 = JVar3.tag;
          v_00.tag = in_stack_fffffffffffffe60;
          v_00.u.ptr = in_stack_fffffffffffffe58.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       v_00);
          v_01.tag = in_stack_fffffffffffffe60;
          v_01.u.ptr = in_stack_fffffffffffffe58.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       v_01);
          v_04.tag = local_110;
          v_04.u.float64 = local_118.float64;
          iVar2 = JS_IsException(v_04);
          if (iVar2 != 0) {
            return -1;
          }
        }
        if (0 < in_stack_00000010) {
          val.u._4_4_ = in_stack_fffffffffffffe54;
          val.u.int32 = in_stack_fffffffffffffe50;
          val.tag = (int64_t)in_stack_fffffffffffffe58.ptr;
          iVar2 = JS_IsArray((JSContext *)in_stack_fffffffffffffe48,val);
          if (iVar2 < 0) goto LAB_001b4538;
          if (iVar2 != 0) {
            obj.u._4_4_ = in_stack_fffffffffffffe7c;
            obj.u.int32 = in_stack_fffffffffffffe78;
            obj.tag = (int64_t)in_stack_fffffffffffffe80;
            iVar2 = js_get_length64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,obj);
            if (iVar2 < 0) goto LAB_001b4538;
            in_stack_fffffffffffffe50 = in_stack_00000010 + -1;
            in_stack_fffffffffffffeb8 = 0;
            in_stack_fffffffffffffec0 = (JSValue *)0x3;
            in_stack_fffffffffffffea8 = 0;
            in_stack_fffffffffffffeb0 = (JSContext *)0x3;
            in_stack_fffffffffffffe58.ptr = (void *)((ulong)in_stack_fffffffffffffebc << 0x20);
            in_stack_fffffffffffffe60 = 3;
            in_stack_fffffffffffffe68 = (int64_t *)((ulong)in_stack_fffffffffffffeac << 0x20);
            in_stack_fffffffffffffe70 = (JSContext *)0x3;
            target_00.tag = in_RSI;
            target_00.u.float64 = in_R8.float64;
            source_00.tag = in_RCX;
            source_00.u.ptr = in_RDI.ptr;
            mapperFunction_00._4_12_ = in_stack_00000014;
            mapperFunction_00.u.int32 = in_stack_00000010;
            in_stack_fffffffffffffe48 = _iStack0000000000000008;
            _iStack0000000000000008 =
                 (JSValueUnion *)
                 JS_FlattenIntoArray(in_R9,target_00,source_00,local_110,unaff_retaddr,
                                     iStack0000000000000008,mapperFunction_00,in_stack_00000020);
            if ((long)_iStack0000000000000008 < 0) goto LAB_001b4538;
            v_02.tag = in_stack_fffffffffffffe60;
            v_02.u.ptr = in_stack_fffffffffffffe58.ptr;
            JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         v_02);
            goto LAB_001b450d;
          }
        }
        if (0x1ffffffffffffe < (long)_iStack0000000000000008) {
          JS_ThrowTypeError((JSContext *)in_RDI.ptr,"Array too long");
LAB_001b4538:
          v_03.tag = in_stack_fffffffffffffe60;
          v_03.u.ptr = in_stack_fffffffffffffe58.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       v_03);
          return -1;
        }
        in_stack_fffffffffffffe48 =
             (JSValueUnion *)CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),0x4007);
        this_obj_00.tag = (int64_t)pJVar5;
        this_obj_00.u.ptr = JVar4.ptr;
        val_00.u._4_4_ = in_stack_fffffffffffffe7c;
        val_00.u.int32 = in_stack_fffffffffffffe78;
        val_00.tag = (int64_t)in_stack_fffffffffffffe80;
        iVar2 = JS_DefinePropertyValueInt64
                          (in_stack_fffffffffffffe70,this_obj_00,(int64_t)in_stack_fffffffffffffe68,
                           val_00,(int)in_stack_ffffffffffffff00);
        if (iVar2 < 0) {
          return -1;
        }
        _iStack0000000000000008 = (JSValueUnion *)((long)_iStack0000000000000008 + 1);
      }
LAB_001b450d:
    }
    local_70 = _iStack0000000000000008;
  }
  else {
    JS_ThrowStackOverflow((JSContext *)0x1b3fe8);
    local_70 = (JSValueUnion *)0xffffffffffffffff;
  }
  return (int64_t)local_70;
}

Assistant:

static int64_t JS_FlattenIntoArray(JSContext *ctx, JSValueConst target,
                                   JSValueConst source, int64_t sourceLen,
                                   int64_t targetIndex, int depth,
                                   JSValueConst mapperFunction,
                                   JSValueConst thisArg)
{
    JSValue element;
    int64_t sourceIndex, elementLen;
    int present, is_array;

    if (js_check_stack_overflow(ctx->rt, 0)) {
        JS_ThrowStackOverflow(ctx);
        return -1;
    }

    for (sourceIndex = 0; sourceIndex < sourceLen; sourceIndex++) {
        present = JS_TryGetPropertyInt64(ctx, source, sourceIndex, &element);
        if (present < 0)
            return -1;
        if (!present)
            continue;
        if (!JS_IsUndefined(mapperFunction)) {
            JSValueConst args[3] = { element, JS_NewInt64(ctx, sourceIndex), source };
            element = JS_Call(ctx, mapperFunction, thisArg, 3, args);
            JS_FreeValue(ctx, (JSValue)args[0]);
            JS_FreeValue(ctx, (JSValue)args[1]);
            if (JS_IsException(element))
                return -1;
        }
        if (depth > 0) {
            is_array = JS_IsArray(ctx, element);
            if (is_array < 0)
                goto fail;
            if (is_array) {
                if (js_get_length64(ctx, &elementLen, element) < 0)
                    goto fail;
                targetIndex = JS_FlattenIntoArray(ctx, target, element,
                                                  elementLen, targetIndex,
                                                  depth - 1,
                                                  JS_UNDEFINED, JS_UNDEFINED);
                if (targetIndex < 0)
                    goto fail;
                JS_FreeValue(ctx, element);
                continue;
            }
        }
        if (targetIndex >= MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array too long");
            goto fail;
        }
        if (JS_DefinePropertyValueInt64(ctx, target, targetIndex, element,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            return -1;
        targetIndex++;
    }
    return targetIndex;

fail:
    JS_FreeValue(ctx, element);
    return -1;
}